

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ResolveOrderGroupBy(Parse *pParse,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  ushort uVar1;
  ExprList *pEList;
  bool bVar2;
  int iVar3;
  ExprList_item *pEVar4;
  uint uVar5;
  
  iVar3 = 0;
  if ((pOrderBy != (ExprList *)0x0) && (iVar3 = 0, pParse->db->mallocFailed == '\0')) {
    if (pParse->db->aLimit[2] < pOrderBy->nExpr) {
      sqlite3ErrorMsg(pParse,"too many terms in %s BY clause",zType);
LAB_001758e0:
      iVar3 = 1;
    }
    else if (0 < pOrderBy->nExpr) {
      pEList = pSelect->pEList;
      pEVar4 = pOrderBy->a;
      uVar5 = 1;
      do {
        uVar1 = (pEVar4->u).x.iOrderByCol;
        if (uVar1 != 0) {
          if (pEList->nExpr < (int)(uint)uVar1) {
            sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)uVar5,zType);
            goto LAB_001758e0;
          }
          resolveAlias(pParse,pEList,uVar1 - 1,pEVar4->pExpr,zType,0);
        }
        pEVar4 = pEVar4 + 1;
        bVar2 = (int)uVar5 < pOrderBy->nExpr;
        uVar5 = uVar5 + 1;
      } while (bVar2);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveOrderGroupBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect,      /* The SELECT statement containing the clause */
  ExprList *pOrderBy,   /* The ORDER BY or GROUP BY clause to be processed */
  const char *zType     /* "ORDER" or "GROUP" */
){
  int i;
  sqlite3 *db = pParse->db;
  ExprList *pEList;
  struct ExprList_item *pItem;

  if( pOrderBy==0 || pParse->db->mallocFailed ) return 0;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in %s BY clause", zType);
    return 1;
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );  /* sqlite3SelectNew() guarantees this */
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    if( pItem->u.x.iOrderByCol ){
      if( pItem->u.x.iOrderByCol>pEList->nExpr ){
        resolveOutOfRangeError(pParse, zType, i+1, pEList->nExpr);
        return 1;
      }
      resolveAlias(pParse, pEList, pItem->u.x.iOrderByCol-1, pItem->pExpr,
                   zType,0);
    }
  }
  return 0;
}